

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O2

int * __thiscall BPlusTree<int>::find(BPlusTree<int> *this,int *entry)

{
  Array<int> *data;
  int iVar1;
  int *piVar2;
  BPlusTree<int> **ppBVar3;
  size_t index;
  
  do {
    data = &this->data;
    iVar1 = b_array::first_ge<int>(data,this->data_size,entry);
    index = (size_t)iVar1;
    if ((index < this->data_size) &&
       (piVar2 = b_array::Array<int>::operator[](data,index), *piVar2 == *entry)) {
      if (this->subset_size == 0) {
        piVar2 = b_array::Array<int>::operator[](data,index);
        return piVar2;
      }
      index = index + 1;
    }
    else if (this->subset_size == 0) {
      return (int *)0x0;
    }
    ppBVar3 = b_array::Array<BPlusTree<int>_*>::operator[](&this->subset,index);
    this = *ppBVar3;
  } while( true );
}

Assistant:

T* BPlusTree<T>::find(const T& entry) {
    size_t index = b_array::first_ge(data, data_size, entry);
    bool found = index < data_size && data[index] == entry;
    if (found && is_leaf())
        return &data[index];
    else if (found && !is_leaf())
        return subset[index + 1]->find(entry);
    else if (!found && !is_leaf())
        return subset[index]->find(entry);
    else if (!found && is_leaf())
        return nullptr;
    return nullptr;
}